

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O1

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  stbrp_rect *psVar1;
  ushort uVar2;
  ushort uVar3;
  undefined1 auVar4 [16];
  stbrp_context *psVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  stbrp_node **ppsVar9;
  long extraout_RAX;
  long lVar10;
  int *piVar11;
  stbrp_context *psVar12;
  undefined4 in_register_00000014;
  ulong uVar13;
  int iVar14;
  stbrp_context *psVar15;
  stbrp_node *psVar16;
  stbrp_context *psVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  stbrp_node **ppsVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int waste;
  int local_a4;
  stbrp_node **local_98;
  int local_88;
  int local_84;
  undefined8 local_80;
  ulong local_78;
  stbrp_node **local_70;
  ulong local_68;
  stbrp_rect *local_60;
  ulong local_58;
  stbrp_rect *local_50;
  ulong local_48;
  size_t local_40;
  stbrp_node *local_38;
  
  auVar4 = _DAT_0018c510;
  local_80 = CONCAT44(in_register_00000014,num_rects);
  uVar20 = (ulong)(uint)num_rects;
  if (0 < num_rects) {
    lVar10 = uVar20 - 1;
    auVar23._8_4_ = (int)lVar10;
    auVar23._0_8_ = lVar10;
    auVar23._12_4_ = (int)((ulong)lVar10 >> 0x20);
    piVar11 = &rects[1].was_packed;
    uVar13 = 0;
    auVar23 = auVar23 ^ _DAT_0018c510;
    auVar24 = _DAT_0018c500;
    do {
      auVar25 = auVar24 ^ auVar4;
      if ((bool)(~(auVar25._4_4_ == auVar23._4_4_ && auVar23._0_4_ < auVar25._0_4_ ||
                  auVar23._4_4_ < auVar25._4_4_) & 1)) {
        piVar11[-4] = (int)uVar13;
      }
      if ((auVar25._12_4_ != auVar23._12_4_ || auVar25._8_4_ <= auVar23._8_4_) &&
          auVar25._12_4_ <= auVar23._12_4_) {
        *piVar11 = (int)uVar13 + 1;
      }
      uVar13 = uVar13 + 2;
      lVar10 = auVar24._8_8_;
      auVar24._0_8_ = auVar24._0_8_ + 2;
      auVar24._8_8_ = lVar10 + 2;
      piVar11 = piVar11 + 8;
    } while ((num_rects + 1U & 0xfffffffe) != uVar13);
  }
  local_40 = (size_t)num_rects;
  psVar17 = context;
  qsort(rects,local_40,0x10,rect_height_compare);
  if (0 < num_rects) {
    local_70 = &context->active_head;
    uVar13 = 0;
    local_68 = uVar20;
    local_60 = rects;
    do {
      psVar1 = rects + uVar13;
      uVar2 = rects[uVar13].w;
      if ((uVar2 == 0) || (local_78 = (ulong)psVar1->h, psVar1->h == 0)) {
        psVar1->x = 0;
        psVar1->y = 0;
      }
      else {
        iVar8 = context->width;
        iVar18 = (uint)uVar2 + context->align + -1;
        iVar18 = iVar18 - iVar18 % context->align;
        psVar12 = (stbrp_context *)context->active_head;
        uVar3 = (ushort)psVar12->width;
        psVar16 = (stbrp_node *)(ulong)uVar3;
        local_58 = (ulong)uVar2;
        local_50 = psVar1;
        local_48 = uVar13;
        local_38 = psVar16;
        if (iVar8 < (int)(iVar18 + (uint)uVar3)) {
          iVar14 = 0x40000000;
          local_98 = (stbrp_node **)0x0;
          local_a4 = 0x40000000;
        }
        else {
          local_a4 = 0x40000000;
          local_98 = (stbrp_node **)0x0;
          iVar14 = 0x40000000;
          psVar15 = psVar12;
          ppsVar21 = local_70;
          do {
            iVar6 = stbrp__skyline_find_min_y(psVar15,psVar16,iVar18,(int)&local_84,&psVar17->width)
            ;
            if (context->heuristic == 0) {
              if (iVar6 < iVar14) {
                iVar14 = iVar6;
                local_98 = ppsVar21;
              }
            }
            else if (((int)local_78 + iVar6 <= context->height) &&
                    ((iVar6 < iVar14 || ((iVar6 == iVar14 && (local_84 < local_a4)))))) {
              local_a4 = local_84;
              iVar14 = iVar6;
              local_98 = ppsVar21;
            }
            ppsVar21 = (stbrp_node **)&psVar15->align;
            uVar2 = (ushort)(*(stbrp_context **)&psVar15->align)->width;
            psVar16 = (stbrp_node *)(ulong)uVar2;
            psVar15 = *(stbrp_context **)&psVar15->align;
          } while ((int)(iVar18 + (uint)uVar2) <= iVar8);
        }
        if (local_98 == (stbrp_node **)0x0) {
          uVar7 = 0;
        }
        else {
          uVar7 = (uint)(*local_98)->x;
        }
        if (context->heuristic == 1) {
          psVar15 = psVar12;
          uVar19 = (uint)local_38;
          while (ppsVar21 = local_70, (int)uVar19 < iVar18) {
            psVar15 = *(stbrp_context **)&psVar15->align;
            uVar19 = (uint)(ushort)psVar15->width;
          }
          do {
            uVar19 = (uint)(ushort)psVar15->width - iVar18;
            psVar5 = psVar12;
            do {
              psVar12 = psVar5;
              ppsVar9 = ppsVar21;
              ppsVar21 = (stbrp_node **)&psVar12->align;
              psVar5 = *(stbrp_context **)&psVar12->align;
            } while ((int)(uint)(ushort)(*(stbrp_context **)&psVar12->align)->width <= (int)uVar19);
            iVar8 = stbrp__skyline_find_min_y
                              (psVar12,(stbrp_node *)(ulong)uVar19,iVar18,(int)&local_88,
                               &psVar17->width);
            if ((((int)local_78 + iVar8 < context->height) && (iVar8 <= iVar14)) &&
               (((iVar8 < iVar14 || (local_88 < local_a4)) ||
                ((local_88 == local_a4 && ((int)uVar19 < (int)uVar7)))))) {
              local_a4 = local_88;
              iVar14 = iVar8;
              local_98 = ppsVar9;
              uVar7 = uVar19;
            }
            psVar15 = *(stbrp_context **)&psVar15->align;
            ppsVar21 = ppsVar9;
          } while (psVar15 != (stbrp_context *)0x0);
        }
        rects = local_60;
        uVar13 = local_48;
        uVar20 = local_68;
        if (((local_98 == (stbrp_node **)0x0) ||
            (iVar8 = (int)local_78 + iVar14, context->height < iVar8)) ||
           (psVar16 = context->free_head, psVar16 == (stbrp_node *)0x0)) {
          local_50->x = 0xffff;
          local_50->y = 0xffff;
        }
        else {
          psVar16->x = (stbrp_coord)uVar7;
          psVar16->y = (stbrp_coord)iVar8;
          context->free_head = psVar16->next;
          psVar17 = (stbrp_context *)*local_98;
          psVar12 = psVar17;
          if ((int)(uint)(ushort)psVar17->width < (int)uVar7) {
            psVar12 = *(stbrp_context **)&psVar17->align;
            local_98 = (stbrp_node **)&psVar17->align;
          }
          *local_98 = psVar16;
          psVar17 = *(stbrp_context **)&psVar12->align;
          if (psVar17 != (stbrp_context *)0x0) {
            do {
              psVar15 = psVar17;
              uVar2 = (ushort)psVar15->width;
              psVar17 = (stbrp_context *)(ulong)uVar2;
              if ((int)(uVar7 + (int)local_58) < (int)(uint)uVar2) goto LAB_00136688;
              *(stbrp_node **)&psVar12->align = context->free_head;
              context->free_head = (stbrp_node *)psVar12;
              psVar12 = psVar15;
              psVar17 = *(stbrp_context **)&psVar15->align;
            } while (*(stbrp_context **)&psVar15->align != (stbrp_context *)0x0);
            psVar17 = (stbrp_context *)0x0;
          }
LAB_00136688:
          psVar16->next = (stbrp_node *)psVar12;
          iVar8 = (int)local_58 + uVar7;
          if ((int)(uint)(ushort)psVar12->width < iVar8) {
            *(short *)&psVar12->width = (short)iVar8;
          }
          local_50->x = (stbrp_coord)uVar7;
          local_50->y = (stbrp_coord)iVar14;
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar20);
  }
  qsort(rects,local_40,0x10,rect_original_order);
  lVar10 = extraout_RAX;
  if (0 < (int)local_80) {
    lVar10 = 0;
    do {
      bVar22 = true;
      if (*(short *)((long)&rects->x + lVar10) == -1) {
        bVar22 = *(short *)((long)&rects->y + lVar10) != -1;
      }
      *(uint *)((long)&rects->was_packed + lVar10) = (uint)bVar22;
      lVar10 = lVar10 + 0x10;
    } while (uVar20 * 0x10 != lVar10);
  }
  return (int)lVar10;
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
      #ifndef STBRP_LARGE_RECTS
      STBRP_ASSERT(rects[i].w <= 0xffff && rects[i].h <= 0xffff);
      #endif
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}